

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmframe.cpp
# Opt level: O0

size_t __thiscall VMScriptFunction::PropagateMark(VMScriptFunction *this)

{
  byte bVar1;
  size_t sVar2;
  uint local_24;
  VM_ATAG *pVStack_20;
  int count;
  VM_UBYTE *atag;
  FVoidObj *konsta;
  VMScriptFunction *this_local;
  
  if (this->KonstA != (FVoidObj *)0x0) {
    atag = (VM_UBYTE *)this->KonstA;
    pVStack_20 = KonstATags(this);
    for (local_24 = (uint)this->NumKonstA; 0 < (int)local_24; local_24 = local_24 - 1) {
      if (*pVStack_20 == '\x01') {
        GC::Mark<DObject>((DObject **)atag);
      }
      atag = atag + 8;
      pVStack_20 = pVStack_20 + 1;
    }
  }
  bVar1 = this->NumKonstA;
  sVar2 = DObject::PropagateMark((DObject *)this);
  return (ulong)bVar1 * 8 + sVar2;
}

Assistant:

size_t VMScriptFunction::PropagateMark()
{
	if (KonstA != NULL)
	{
		FVoidObj *konsta = KonstA;
		VM_UBYTE *atag = KonstATags();
		for (int count = NumKonstA; count > 0; --count)
		{
			if (*atag++ == ATAG_OBJECT)
			{
				GC::Mark(konsta->o);
			}
			konsta++;
		}
	}
	return NumKonstA * sizeof(void *) + Super::PropagateMark();
}